

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O2

void __thiscall
agge::tests::LayoutTests::LongWordsAreEmergentlyBrokenOnWidthLimit(LayoutTests *this)

{
  wrap limiter;
  wrap limiter_00;
  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
  end;
  long lVar1;
  allocator local_599;
  factory_ptr f;
  int local_584 [9];
  _Vector_base<agge::text_line,_std::allocator<agge::text_line>_> local_560;
  _Vector_base<int,_std::allocator<int>_> local_548;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_530;
  _Vector_base<int,_std::allocator<int>_> local_518;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_500;
  _Vector_base<int,_std::allocator<int>_> local_4e8;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_4d0;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_4b8;
  ref_glyph_run local_4a0;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_468;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_458;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_448;
  string local_438;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_418;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_3f8;
  undefined4 local_3e8;
  undefined4 uStack_3e4;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  uint uStack_3d4;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined4 uStack_3c0;
  uint uStack_3bc;
  LocationInfo local_3b8;
  ref_text_line local_390;
  ref_text_line local_368;
  ref_text_line local_340;
  ref_glyph_run local_318;
  _Vector_base<int,_std::allocator<int>_> local_2e0;
  _Vector_base<int,_std::allocator<int>_> local_2c8;
  _Vector_base<int,_std::allocator<int>_> local_2b0;
  _Vector_base<int,_std::allocator<int>_> local_298;
  _Vector_base<int,_std::allocator<int>_> local_280;
  _Vector_base<int,_std::allocator<int>_> local_268;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_250;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_238;
  _Vector_base<int,_std::allocator<int>_> local_220;
  _Vector_base<int,_std::allocator<int>_> local_208;
  _Vector_base<int,_std::allocator<int>_> local_1f0;
  _Vector_base<int,_std::allocator<int>_> local_1d8;
  _Vector_base<int,_std::allocator<int>_> local_1c0;
  _Vector_base<int,_std::allocator<int>_> local_1a8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_190;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_178;
  richtext_t local_160;
  layout l;
  char_to_index indices [3];
  _Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> local_88;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  end._M_current = (text_line *)indices;
  indices[0].symbol = 0x41;
  indices[0].index = 0;
  indices[1].symbol = 0x42;
  indices[1].index = 1;
  indices[2].symbol = 0x43;
  indices[2].index = 2;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 0x4000000000000000;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0x4008000000000000;
  local_30 = 0;
  uStack_28 = 0;
  local_20 = 0;
  uStack_18 = 0;
  create_single_font_factory<3ul,3ul>
            ((LayoutTests *)&f,(font_metrics *)this,
             (char_to_index (*) [3])(anonymous_namespace)::c_fm1,(glyph (*) [3])end._M_current);
  layout::layout(&l);
  std::__cxx11::string::string((string *)&local_4a0,"ABCABCABC",(allocator *)&local_318);
  R(&local_160,(string *)&local_4a0);
  local_3d0 = 0x40c00000;
  uStack_3cc = 0;
  uStack_3c8 = 0;
  uStack_3c4 = 0;
  uStack_3c0 = 0;
  uStack_3bc = uStack_3bc & 0xffffff00;
  lVar1 = (ulong)uStack_3bc << 0x20;
  limiter._sow.next = (int)lVar1;
  limiter._previous_space = (bool)(char)((ulong)lVar1 >> 0x20);
  limiter._21_3_ = (int3)((ulong)lVar1 >> 0x28);
  limiter._limit = 6.0;
  limiter._eow.extent = 0.0;
  limiter._eow.next = 0;
  limiter._sow.extent = 0.0;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            (&l,&local_160,limiter,
             f.
             super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_160);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3f8,
             &((f.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_584[8] = 0;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_1c0,(plural_ *)&plural,
                     local_584 + 8);
  local_584[7] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_1a8,
                   (vector<int,_std::allocator<int>_> *)&local_1c0,local_584 + 7);
  local_584[6] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_4e8,
                   (vector<int,_std::allocator<int>_> *)&local_1a8,local_584 + 6);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)&local_160,(shared_ptr<agge::font> *)&local_3f8,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_4e8);
  plural_::operator+(&local_4d0,(plural_ *)&plural,(ref_glyph_run *)&local_160);
  ref_text_line::ref_text_line(&local_340,0.0,10.0,6.0,&local_4d0);
  plural_::operator+(&local_190,(plural_ *)&plural,&local_340);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_408,
             &((f.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_584[5] = 0;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_1f0,(plural_ *)&plural,
                     local_584 + 5);
  local_584[4] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_1d8,
                   (vector<int,_std::allocator<int>_> *)&local_1f0,local_584 + 4);
  local_584[3] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_518,
                   (vector<int,_std::allocator<int>_> *)&local_1d8,local_584 + 3);
  ref_glyph_run::ref_glyph_run<int>
            (&local_4a0,(shared_ptr<agge::font> *)&local_408,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_518);
  plural_::operator+(&local_500,(plural_ *)&plural,&local_4a0);
  ref_text_line::ref_text_line(&local_368,0.0,24.0,6.0,&local_500);
  tests::operator+(&local_178,&local_190,&local_368);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_418,
             &((f.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_584[2] = 0;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_220,(plural_ *)&plural,
                     local_584 + 2);
  local_584[1] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_208,
                   (vector<int,_std::allocator<int>_> *)&local_220,local_584 + 1);
  local_584[0] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_548,
                   (vector<int,_std::allocator<int>_> *)&local_208,local_584);
  ref_glyph_run::ref_glyph_run<int>
            (&local_318,(shared_ptr<agge::font> *)&local_418,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_548);
  plural_::operator+(&local_530,(plural_ *)&plural,&local_318);
  ref_text_line::ref_text_line(&local_390,0.0,38.0,6.0,&local_530);
  tests::operator+(&local_4b8,&local_178,&local_390);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            ((vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_560,
             (tests *)l._text_lines.
                      super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )l._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
               _M_impl.super__Vector_impl_data._M_finish,end);
  std::__cxx11::string::string
            ((string *)&local_438,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_599);
  ut::LocationInfo::LocationInfo(&local_3b8,&local_438,0x19f);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_4b8,(vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_560,
             &local_3b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_438);
  std::_Vector_base<agge::text_line,_std::allocator<agge::text_line>_>::~_Vector_base(&local_560);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_4b8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_390._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_530);
  ref_glyph_run::~ref_glyph_run(&local_318);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_548);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_208);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_220);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_418._M_refcount);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_178);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_368._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_500);
  ref_glyph_run::~ref_glyph_run(&local_4a0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_518);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_408._M_refcount);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_190);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_340._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_4d0);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)&local_160);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_4e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3f8._M_refcount);
  std::__cxx11::string::string((string *)&local_4a0,"ABCABCABC",(allocator *)&local_318);
  R(&local_160,(string *)&local_4a0);
  local_3e8 = 0x41000000;
  uStack_3e4 = 0;
  uStack_3e0 = 0;
  uStack_3dc = 0;
  uStack_3d8 = 0;
  uStack_3d4 = uStack_3d4 & 0xffffff00;
  lVar1 = (ulong)uStack_3d4 << 0x20;
  limiter_00._sow.next = (int)lVar1;
  limiter_00._previous_space = (bool)(char)((ulong)lVar1 >> 0x20);
  limiter_00._21_3_ = (int3)((ulong)lVar1 >> 0x28);
  limiter_00._limit = 8.0;
  limiter_00._eow.extent = 0.0;
  limiter_00._eow.next = 0;
  limiter_00._sow.extent = 0.0;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            (&l,&local_160,limiter_00,
             f.
             super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_160);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_448,
             &((f.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_584[8] = 0;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_298,(plural_ *)&plural,
                     local_584 + 8);
  local_584[7] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_280,
                   (vector<int,_std::allocator<int>_> *)&local_298,local_584 + 7);
  local_584[6] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_268,
                   (vector<int,_std::allocator<int>_> *)&local_280,local_584 + 6);
  local_584[5] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_4e8,
                   (vector<int,_std::allocator<int>_> *)&local_268,local_584 + 5);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)&local_160,(shared_ptr<agge::font> *)&local_448,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_4e8);
  plural_::operator+(&local_4d0,(plural_ *)&plural,(ref_glyph_run *)&local_160);
  ref_text_line::ref_text_line(&local_340,0.0,10.0,7.0,&local_4d0);
  plural_::operator+(&local_250,(plural_ *)&plural,&local_340);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_458,
             &((f.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_584[4] = 1;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_2e0,(plural_ *)&plural,
                     local_584 + 4);
  local_584[3] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_2c8,
                   (vector<int,_std::allocator<int>_> *)&local_2e0,local_584 + 3);
  local_584[2] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_2b0,
                   (vector<int,_std::allocator<int>_> *)&local_2c8,local_584 + 2);
  local_584[1] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_518,
                   (vector<int,_std::allocator<int>_> *)&local_2b0,local_584 + 1);
  ref_glyph_run::ref_glyph_run<int>
            (&local_4a0,(shared_ptr<agge::font> *)&local_458,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_518);
  plural_::operator+(&local_500,(plural_ *)&plural,&local_4a0);
  ref_text_line::ref_text_line(&local_368,0.0,24.0,8.0,&local_500);
  tests::operator+(&local_238,&local_250,&local_368);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_468,
             &((f.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_584[0] = 2;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_548,(plural_ *)&plural,local_584);
  ref_glyph_run::ref_glyph_run<int>
            (&local_318,(shared_ptr<agge::font> *)&local_468,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_548);
  plural_::operator+(&local_530,(plural_ *)&plural,&local_318);
  ref_text_line::ref_text_line(&local_390,0.0,38.0,3.0,&local_530);
  tests::operator+(&local_4b8,&local_238,&local_390);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            ((vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_560,
             (tests *)l._text_lines.
                      super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )l._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
               _M_impl.super__Vector_impl_data._M_finish,end);
  std::__cxx11::string::string
            ((string *)&local_438,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_599);
  ut::LocationInfo::LocationInfo(&local_3b8,&local_438,0x1a9);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_4b8,(vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_560,
             &local_3b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_438);
  std::_Vector_base<agge::text_line,_std::allocator<agge::text_line>_>::~_Vector_base(&local_560);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_4b8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_390._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_530);
  ref_glyph_run::~ref_glyph_run(&local_318);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_548);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_468._M_refcount);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_238);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_368._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_500);
  ref_glyph_run::~ref_glyph_run(&local_4a0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_518);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2b0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_458._M_refcount);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_250);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_340._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_4d0);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)&local_160);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_4e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_268);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_280);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_298);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_448._M_refcount);
  layout::~layout(&l);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.
              super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  lVar1 = 0x60;
  do {
    std::_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::
    ~_Vector_base((_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *
                  )((long)&local_88._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

test( LongWordsAreEmergentlyBrokenOnWidthLimit )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L'A', 0 }, { L'B', 1 }, { L'C', 2 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 1, 0 } },
					{ { 2, 0 } },
					{ { 3, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);
				layout::const_iterator gr;
				layout l;

				// ACT
				l.process(R("ABCABCABC"), limit::wrap(6.0f), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 6.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 1 + 2))
					+ ref_text_line(0.0f, 24.0f, 6.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 1 + 2))
					+ ref_text_line(0.0f, 38.0f, 6.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 1 + 2)),
					mkvector(l.begin(), l.end()));

				// ACT
				l.process(R("ABCABCABC"), limit::wrap(8.0f), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 7.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 1 + 2 + 0))
					+ ref_text_line(0.0f, 24.0f, 8.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 2 + 0 + 1))
					+ ref_text_line(0.0f, 38.0f, 3.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 2)),
					mkvector(l.begin(), l.end()));
			}